

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

string * __thiscall
Fixpp::Writer::
write<Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)48>,Fixpp::TagT<112u,Fixpp::Type::String>>>
          (string *__return_storage_ptr__,Writer *this,
          VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
          *header,VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>
                  *message)

{
  bool bVar1;
  _Setfill<char> _Var2;
  _Setw _Var3;
  size_t sVar4;
  size_t sVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  streamsize sVar8;
  streamsize sVar9;
  size_t checksum;
  Context context;
  size_t size;
  streamsize endOffset;
  streamsize startOffset;
  string local_750 [32];
  ulong local_730;
  size_t missingBits;
  ostringstream error;
  ostream local_5a0 [8];
  ostream os;
  undefined1 local_490 [8];
  StreamBuf<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>_>
  buf;
  VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>
  *message_local;
  VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  *header_local;
  Writer *this_local;
  
  buf.off_ = (size_t)message;
  StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'0'>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
  ::StreamBufBase((StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
                   *)local_490);
  std::ostream::ostream(local_5a0,(streambuf *)local_490);
  bVar1 = std::bitset<0UL>::all((bitset<0UL> *)(buf.off_ + 0x28));
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&missingBits);
    sVar4 = std::bitset<0UL>::size((bitset<0UL> *)(buf.off_ + 0x28));
    sVar5 = std::bitset<0UL>::count((bitset<0UL> *)(buf.off_ + 0x28));
    local_730 = sVar4 - sVar5;
    poVar6 = std::operator<<((ostream *)&missingBits,"Missing ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_730);
    std::operator<<(poVar6," required value(s) for Message");
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar7,local_750);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::bitset<4UL>::all
                    (&(header->
                      super_MessageT<Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                      ).
                      super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                      .requiredBits);
  if (!bVar1) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Missing values for header");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar8 = StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'0'>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
          ::offset((StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
                    *)local_490);
  writeRaw<Fixpp::TagT<35u,Fixpp::Type::String>>(local_5a0,"0",1);
  write<meta::tuple<Fixpp::Field<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<115u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<128u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<90u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<91u,Fixpp::Type::Data>>,Fixpp::Field<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<50u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<142u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<57u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<143u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<116u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<144u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<129u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<145u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<43u,Fixpp::Type::Boolean>>,Fixpp::Field<Fixpp::TagT<97u,Fixpp::Type::Boolean>>,Fixpp::Field<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::Field<Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>>,Fixpp::Field<Fixpp::TagT<212u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<213u,Fixpp::Type::Data>>,Fixpp::Field<Fixpp::TagT<347u,Fixpp::Type::String>>,Fixpp::Field<Fixpp::TagT<369u,Fixpp::Type::Int>>,Fixpp::Field<Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul>
            (this,local_5a0,header);
  write<meta::tuple<Fixpp::Field<Fixpp::TagT<112u,Fixpp::Type::String>>>,0ul>
            (this,local_5a0,buf.off_);
  sVar9 = StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'0'>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
          ::offset((StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
                    *)local_490);
  context.epptr = (char *)(sVar9 - sVar8);
  StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'0'>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
  ::save((Context *)&checksum,
         (StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
          *)local_490);
  StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'0'>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
  ::prepareWriteHeader
            ((StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
              *)local_490,(size_t)context.epptr);
  writeTag<Fixpp::TagT<8u,Fixpp::Type::String>,char_const*const&>
            (local_5a0,&v42::__VersionStaticHolder<Fixpp::v42::Version>::Str);
  poVar6 = (ostream *)std::ostream::operator<<(local_5a0,9);
  poVar6 = std::operator<<(poVar6,"=");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(ulong)context.epptr);
  std::operator<<(poVar6,'|');
  StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'0'>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
  ::restore((StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
             *)local_490,(Context *)&checksum);
  sVar4 = StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'0'>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
          ::checksum((StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
                      *)local_490);
  poVar6 = std::operator<<(local_5a0,"10=");
  _Var2 = std::setfill<char>('0');
  poVar6 = std::operator<<(poVar6,_Var2._M_c);
  _Var3 = std::setw(3);
  poVar6 = std::operator<<(poVar6,_Var3);
  std::ostream::operator<<(poVar6,sVar4);
  std::operator<<(local_5a0,'|');
  StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)48>,Fixpp::TagT<112u,Fixpp::Type::String>>,1024ul>
  ::asString_abi_cxx11_(__return_storage_ptr__,local_490);
  std::ostream::~ostream(local_5a0);
  StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'0'>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
  ::~StreamBufBase((StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
                    *)local_490);
  return __return_storage_ptr__;
}

Assistant:

std::string write(const Header& header, const Message& message)
    {
        StreamBuf<Message> buf;
        std::ostream os(&buf);

        if (!message.requiredBits.all())
        {
            std::ostringstream error;
            const size_t missingBits = message.requiredBits.size() - message.requiredBits.count();
            error << "Missing " << missingBits << " required value(s) for Message";
            throw std::runtime_error(error.str());
        }

        if (!header.requiredBits.all())
        {
            throw std::runtime_error("Missing values for header");
        }

        const auto startOffset = buf.offset();

        writeRaw<Tag::MsgType>(os, Message::MsgType::Value, Message::MsgType::Size);
        write(os, header.values, meta::seq::make_index_sequence<Header::TotalTags>());
        write(os, message.values, meta::seq::make_index_sequence<Message::TotalTags>());

        const auto endOffset = buf.offset();        

        const size_t size = endOffset - startOffset;

        auto context = buf.save();

        buf.prepareWriteHeader(size);

        writeTag<Tag::BeginString>(os, Message::Version::Str);
        os << Tag::BodyLength::Id << "=" << size << SOH;

        buf.restore(context);

        const size_t checksum = buf.checksum();
        os << "10=" << std::setfill('0') << std::setw(3) << checksum;

        os << SOH;

        return buf.asString();
    }